

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

void aom_calc_psnr(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,PSNR_STATS *psnr)

{
  double dVar1;
  double *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar2;
  uint64_t sse;
  uint32_t samples;
  int h;
  int w;
  uint32_t total_samples;
  uint64_t total_sse;
  int i;
  int b_strides [3];
  int a_strides [3];
  int heights [3];
  int widths [3];
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int iVar3;
  double dVar4;
  int height;
  int width;
  int b_stride;
  undefined4 uVar5;
  undefined4 uVar6;
  int a_stride;
  undefined4 uVar7;
  undefined4 uVar8;
  int local_24 [3];
  double *local_18;
  
  local_24[0] = *(int *)(in_RDI + 0x10);
  local_24[1] = *(undefined4 *)(in_RDI + 0x14);
  local_24[2] = *(undefined4 *)(in_RDI + 0x14);
  uVar7 = *(undefined4 *)(in_RDI + 0x18);
  uVar8 = *(undefined4 *)(in_RDI + 0x1c);
  uVar6 = *(undefined4 *)(in_RDI + 0x20);
  a_stride = *(int *)(in_RDI + 0x24);
  width = *(int *)(in_RSI + 0x20);
  b_stride = *(int *)(in_RSI + 0x24);
  uVar5 = *(undefined4 *)(in_RSI + 0x24);
  dVar4 = 0.0;
  iVar3 = 0;
  local_18 = in_RDX;
  for (height = 0; height < 3; height = height + 1) {
    in_stack_ffffffffffffffa0 = local_24[height];
    in_stack_ffffffffffffff9c = *(int *)(&stack0xffffffffffffffd0 + (long)height * 4);
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffffa0 * in_stack_ffffffffffffff9c;
    dVar1 = (double)get_sse((uint8_t *)CONCAT44(uVar8,uVar7),a_stride,
                            (uint8_t *)CONCAT44(uVar6,uVar5),b_stride,width,height);
    local_18[(long)height + 5] = dVar1;
    *(int *)((long)local_18 + (long)height * 4 + 0x44) = in_stack_ffffffffffffff98;
    dVar2 = aom_sse_to_psnr(dVar4,(double)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                            (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_18[height + 1] = dVar2;
    dVar4 = (double)((long)dVar1 + (long)dVar4);
    iVar3 = in_stack_ffffffffffffff98 + iVar3;
  }
  local_18[4] = dVar4;
  *(int *)(local_18 + 8) = iVar3;
  dVar4 = aom_sse_to_psnr(dVar4,(double)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                          (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *local_18 = dVar4;
  return;
}

Assistant:

void aom_calc_psnr(const YV12_BUFFER_CONFIG *a, const YV12_BUFFER_CONFIG *b,
                   PSNR_STATS *psnr) {
  assert(a->y_crop_width == b->y_crop_width);
  assert(a->y_crop_height == b->y_crop_height);
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  static const double peak = 255.0;
  const int widths[3] = { a->y_crop_width, a->uv_crop_width, a->uv_crop_width };
  const int heights[3] = { a->y_crop_height, a->uv_crop_height,
                           a->uv_crop_height };
  const int a_strides[3] = { a->y_stride, a->uv_stride, a->uv_stride };
  const int b_strides[3] = { b->y_stride, b->uv_stride, b->uv_stride };
  int i;
  uint64_t total_sse = 0;
  uint32_t total_samples = 0;

  for (i = 0; i < 3; ++i) {
    const int w = widths[i];
    const int h = heights[i];
    const uint32_t samples = w * h;
    const uint64_t sse =
        get_sse(a->buffers[i], a_strides[i], b->buffers[i], b_strides[i], w, h);
    psnr->sse[1 + i] = sse;
    psnr->samples[1 + i] = samples;
    psnr->psnr[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);

    total_sse += sse;
    total_samples += samples;
  }

  psnr->sse[0] = total_sse;
  psnr->samples[0] = total_samples;
  psnr->psnr[0] =
      aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);
}